

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::initFromPath
          (BinaryRegistryWriter *this,string *srcPath)

{
  undefined4 index_00;
  bool bVar1;
  char *__s;
  ProgramBinary *pPVar2;
  DefaultDeleter<vk::ProgramBinary> local_f2;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  UniquePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> binary;
  undefined1 local_b8 [4];
  deUint32 index;
  string baseName;
  FilePath path;
  FilePath local_68;
  undefined1 local_48 [8];
  DirectoryIterator iter;
  string *srcPath_local;
  BinaryRegistryWriter *this_local;
  
  iter.m_curEntry = (dirent *)srcPath;
  de::FilePath::FilePath(&local_68,srcPath);
  de::DirectoryIterator::DirectoryIterator((DirectoryIterator *)local_48,&local_68);
  de::FilePath::~FilePath(&local_68);
  while (bVar1 = de::DirectoryIterator::hasItem((DirectoryIterator *)local_48), bVar1) {
    de::DirectoryIterator::getItem
              ((FilePath *)((long)&baseName.field_2 + 8),(DirectoryIterator *)local_48);
    de::FilePath::getBaseName_abi_cxx11_
              ((string *)local_b8,(FilePath *)((long)&baseName.field_2 + 8));
    bVar1 = anon_unknown_8::isProgramFileName((string *)local_b8);
    if (bVar1) {
      binary.super_UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>.m_data.
      _12_4_ = anon_unknown_8::getProgramIndexFromName((string *)local_b8);
      __s = de::FilePath::getPath((FilePath *)((long)&baseName.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,__s,&local_f1);
      pPVar2 = anon_unknown_8::readBinary(&local_f0);
      de::DefaultDeleter<vk::ProgramBinary>::DefaultDeleter(&local_f2);
      de::details::UniquePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::UniquePtr
                ((UniquePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *)local_d0,
                 pPVar2);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      index_00 = binary.super_UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>.
                 m_data._12_4_;
      pPVar2 = de::details::UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::
               operator*((UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *)
                         local_d0);
      addBinary(this,index_00,pPVar2);
      de::details::UniquePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::~UniquePtr
                ((UniquePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *)local_d0);
    }
    std::__cxx11::string::~string((string *)local_b8);
    de::FilePath::~FilePath((FilePath *)((long)&baseName.field_2 + 8));
    de::DirectoryIterator::next((DirectoryIterator *)local_48);
  }
  de::DirectoryIterator::~DirectoryIterator((DirectoryIterator *)local_48);
  return;
}

Assistant:

void BinaryRegistryWriter::initFromPath (const std::string& srcPath)
{
	DE_ASSERT(m_binaries.empty());

	for (de::DirectoryIterator iter(srcPath); iter.hasItem(); iter.next())
	{
		const de::FilePath	path		= iter.getItem();
		const std::string	baseName	= path.getBaseName();

		if (isProgramFileName(baseName))
		{
			const deUint32						index	= getProgramIndexFromName(baseName);
			const de::UniquePtr<ProgramBinary>	binary	(readBinary(path.getPath()));

			addBinary(index, *binary);
			// \note referenceCount is left to 0 and will only be incremented
			//		 if binary is reused (added via addProgram()).
		}
	}
}